

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O0

void __thiscall
Painter::Painter(Painter *this,
                vector<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>
                *nodes)

{
  Layout layout;
  Dimensions *pDVar1;
  Document *this_00;
  Point local_90;
  Layout local_80;
  allocator local_49;
  string local_48 [48];
  vector<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_> *local_18;
  vector<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_> *nodes_local;
  Painter *this_local;
  
  local_18 = nodes;
  nodes_local = (vector<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_> *)
                this;
  std::vector<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>::vector
            (&this->m_objects);
  this->m_nodes = local_18;
  this->m_draw = false;
  this->m_stopThread = false;
  (this->m_draw_thread)._M_id._M_thread = 0;
  std::thread::thread(&this->m_draw_thread);
  pDVar1 = (Dimensions *)operator_new(0x10);
  svg::Dimensions::Dimensions(pDVar1,100.0,100.0);
  this->m_dimesnions = pDVar1;
  this_00 = (Document *)operator_new(0x70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"network.svg",&local_49);
  pDVar1 = this->m_dimesnions;
  svg::Point::Point(&local_90,0.0,0.0);
  svg::Layout::Layout(&local_80,pDVar1,BottomLeft,1.0,&local_90);
  layout.dimensions.height = local_80.dimensions.height;
  layout.dimensions.width = local_80.dimensions.width;
  layout.scale = local_80.scale;
  layout.origin = local_80.origin;
  layout._28_4_ = local_80._28_4_;
  layout.origin_offset.x = local_80.origin_offset.x;
  layout.origin_offset.y = local_80.origin_offset.y;
  svg::Document::Document(this_00,(string *)local_48,layout);
  this->m_doc = this_00;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

Painter::Painter(std::vector<std::shared_ptr<mmWaveBS>>const &nodes)
:m_draw_thread(),
m_nodes(nodes)
{
// 	m_nodes = &nodes;
	m_dimesnions = new svg::Dimensions(100, 100);
	m_doc = new svg::Document("network.svg", svg::Layout(*m_dimesnions, svg::Layout::BottomLeft));
}